

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_type_handler.h
# Opt level: O1

uint8_t * google::protobuf::internal::
          MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
          ::InternalSerialize(int field_number,
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                             *value,uint8_t *ptr,EpsCopyOutputStream *stream)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint8_t *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  string_view s;
  string_view s_00;
  
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  uVar5 = (ulong)(field_number * 8 + 2);
  if (0x7f < (uint)(field_number << 3)) {
    do {
      uVar8 = (uint)uVar5;
      *ptr = (byte)uVar5 | 0x80;
      uVar5 = uVar5 >> 7;
      ptr = ptr + 1;
    } while (0x3fff < uVar8);
  }
  *ptr = (byte)uVar5;
  pbVar10 = ptr + 1;
  uVar8 = (uint)key->_M_string_length;
  uVar7 = uVar8 | 1;
  iVar3 = 0x1f;
  if (uVar7 != 0) {
    for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
    }
  }
  uVar7 = (uint)value->_M_string_length;
  uVar9 = uVar7 | 1;
  iVar4 = 0x1f;
  if (uVar9 != 0) {
    for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
    }
  }
  uVar7 = (iVar4 * 9 + 0x49U >> 6) + uVar8 + uVar7 + (iVar3 * 9 + 0x49U >> 6) + 2;
  uVar8 = uVar7;
  if (0x7f < uVar7) {
    do {
      *pbVar10 = (byte)uVar8 | 0x80;
      uVar7 = uVar8 >> 7;
      pbVar10 = pbVar10 + 1;
      bVar2 = 0x3fff < uVar8;
      uVar8 = uVar7;
    } while (bVar2);
  }
  *pbVar10 = (byte)uVar7;
  pbVar10 = pbVar10 + 1;
  if (stream->end_ <= pbVar10) {
    pbVar10 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar10);
  }
  sVar1 = key->_M_string_length;
  if (((long)sVar1 < 0x80) && ((long)sVar1 <= (long)(stream->end_ + (0xe - (long)pbVar10)))) {
    *pbVar10 = 10;
    pbVar10[1] = (byte)sVar1;
    memcpy(pbVar10 + 2,(key->_M_dataplus)._M_p,sVar1);
    pbVar10 = pbVar10 + sVar1 + 2;
  }
  else {
    s._M_str = (key->_M_dataplus)._M_p;
    s._M_len = sVar1;
    pbVar10 = io::EpsCopyOutputStream::WriteStringOutline(stream,1,s,pbVar10);
  }
  if (stream->end_ <= pbVar10) {
    pbVar10 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar10);
  }
  sVar1 = value->_M_string_length;
  if (((long)sVar1 < 0x80) && ((long)sVar1 <= (long)(stream->end_ + (0xe - (long)pbVar10)))) {
    *pbVar10 = 0x12;
    pbVar10[1] = (byte)sVar1;
    memcpy(pbVar10 + 2,(value->_M_dataplus)._M_p,sVar1);
    return pbVar10 + sVar1 + 2;
  }
  s_00._M_str = (value->_M_dataplus)._M_p;
  s_00._M_len = sVar1;
  puVar6 = io::EpsCopyOutputStream::WriteStringOutline(stream,2,s_00,pbVar10);
  return puVar6;
}

Assistant:

static uint8_t* InternalSerialize(int field_number, const Key& key,
                                    const Value& value, uint8_t* ptr,
                                    io::EpsCopyOutputStream* stream) {
    ptr = stream->EnsureSpace(ptr);
    ptr = WireFormatLite::WriteTagToArray(
        field_number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, ptr);
    ptr = io::CodedOutputStream::WriteVarint32ToArray(GetCachedSize(key, value),
                                                      ptr);

    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key, ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value, ptr, stream);
  }